

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libunicode.c
# Opt level: O3

int unicode_case1(CharRange *cr,int case_mask)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uint32_t *puVar4;
  uint *puVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  uint uVar9;
  uint32_t uVar10;
  bool bVar11;
  bool bVar12;
  uint local_34;
  
  if (case_mask == 0) {
    return 0;
  }
  lVar3 = 0;
  puVar5 = &DAT_001853f0;
  uVar6 = 0;
  do {
    if (((uint)case_mask >> ((uint)lVar3 & 0x1f) & 1) != 0) {
      uVar6 = uVar6 | *puVar5;
    }
    lVar3 = lVar3 + 1;
    puVar5 = puVar5 + 1;
  } while (lVar3 != 3);
  bVar11 = (case_mask & 1U) == 0;
  local_34 = case_mask & 1;
  bVar12 = (case_mask & 6U) == 0;
  lVar3 = 0;
  do {
    uVar7 = case_conv_table1[lVar3];
    uVar1 = uVar7 >> 4 & 0xf;
    if ((uVar6 >> uVar1 & 1) != 0) {
      uVar9 = uVar7 >> 0xf;
      uVar7 = uVar7 >> 8 & 0x7f;
      if (uVar1 == 5) {
        if (!bVar12 && !bVar11) goto LAB_00172b4c;
        if (local_34 == 0) {
          iVar2 = cr->len;
          if (cr->size < iVar2 + 2) {
            iVar2 = cr_realloc(cr,iVar2 + 2);
            if (iVar2 != 0) {
              return -1;
            }
            iVar2 = cr->len;
          }
          puVar4 = cr->points;
          cr->len = iVar2 + 1;
          puVar4[iVar2] = uVar9;
          iVar2 = cr->len;
          cr->len = iVar2 + 1;
          puVar4[iVar2] = uVar9 + 1;
        }
        iVar2 = cr->len;
        if (cr->size < iVar2 + 2) {
          iVar2 = cr_realloc(cr,iVar2 + 2);
          if (iVar2 != 0) {
            return -1;
          }
          iVar2 = cr->len;
        }
        uVar10 = uVar9 + 2;
        puVar4 = cr->points;
        cr->len = iVar2 + 1;
        puVar4[iVar2] = uVar9 + 1;
        iVar2 = cr->len;
        cr->len = iVar2 + 1;
        puVar4[iVar2] = uVar10;
        if (local_34 == 0) goto LAB_00172b95;
        uVar8 = uVar9 + 3;
        iVar2 = cr->len;
        if (cr->size < iVar2 + 2) {
          iVar2 = cr_realloc(cr,iVar2 + 2);
          uVar9 = uVar10;
          goto LAB_00172b67;
        }
      }
      else {
        if ((uVar1 == 4) && (bVar12 || bVar11)) {
          if (uVar7 != 0) {
            uVar1 = 0;
            do {
              iVar2 = cr->len;
              if (cr->size < iVar2 + 2) {
                iVar2 = cr_realloc(cr,iVar2 + 2);
                if (iVar2 != 0) {
                  return -1;
                }
                iVar2 = cr->len;
              }
              puVar4 = cr->points;
              cr->len = iVar2 + 1;
              puVar4[iVar2] = uVar9 + local_34 + uVar1;
              iVar2 = cr->len;
              cr->len = iVar2 + 1;
              puVar4[iVar2] = uVar9 + local_34 + uVar1 + 1;
              uVar1 = uVar1 + 2;
            } while (uVar1 < uVar7);
          }
          goto LAB_00172b95;
        }
LAB_00172b4c:
        uVar8 = uVar7 + uVar9;
        iVar2 = cr->len;
        if (cr->size < iVar2 + 2) {
          iVar2 = cr_realloc(cr,iVar2 + 2);
LAB_00172b67:
          if (iVar2 != 0) {
            return -1;
          }
          iVar2 = cr->len;
        }
        puVar4 = cr->points;
        uVar10 = uVar9;
      }
      cr->len = iVar2 + 1;
      puVar4[iVar2] = uVar10;
      iVar2 = cr->len;
      cr->len = iVar2 + 1;
      puVar4[iVar2] = uVar8;
    }
LAB_00172b95:
    lVar3 = lVar3 + 1;
    if (lVar3 == 0x169) {
      return 0;
    }
  } while( true );
}

Assistant:

static int unicode_case1(CharRange *cr, int case_mask)
{
#define MR(x) (1 << RUN_TYPE_ ## x)
    const uint32_t tab_run_mask[3] = {
        MR(U) | MR(UF) | MR(UL) | MR(LSU) | MR(U2L_399_EXT2) | MR(UF_D20) |
        MR(UF_D1_EXT) | MR(U_EXT) | MR(U_EXT2) | MR(U_EXT3),

        MR(L) | MR(LF) | MR(UL) | MR(LSU) | MR(U2L_399_EXT2) | MR(LF_EXT) | MR(L_EXT2),

        MR(UF) | MR(LF) | MR(UL) | MR(LSU) | MR(U2L_399_EXT2) | MR(LF_EXT) | MR(UF_D20) | MR(UF_D1_EXT) | MR(LF_EXT),
    };
#undef MR
    uint32_t mask, v, code, type, len, i, idx;

    if (case_mask == 0)
        return 0;
    mask = 0;
    for(i = 0; i < 3; i++) {
        if ((case_mask >> i) & 1)
            mask |= tab_run_mask[i];
    }
    for(idx = 0; idx < countof(case_conv_table1); idx++) {
        v = case_conv_table1[idx];
        type = (v >> (32 - 17 - 7 - 4)) & 0xf;
        code = v >> (32 - 17);
        len = (v >> (32 - 17 - 7)) & 0x7f;
        if ((mask >> type) & 1) {
            //            printf("%d: type=%d %04x %04x\n", idx, type, code, code + len - 1);
            switch(type) {
            case RUN_TYPE_UL:
                if ((case_mask & CASE_U) && (case_mask & (CASE_L | CASE_F)))
                    goto def_case;
                code += ((case_mask & CASE_U) != 0);
                for(i = 0; i < len; i += 2) {
                    if (cr_add_interval(cr, code + i, code + i + 1))
                        return -1;
                }
                break;
            case RUN_TYPE_LSU:
                if ((case_mask & CASE_U) && (case_mask & (CASE_L | CASE_F)))
                    goto def_case;
                if (!(case_mask & CASE_U)) {
                    if (cr_add_interval(cr, code, code + 1))
                        return -1;
                }
                if (cr_add_interval(cr, code + 1, code + 2))
                    return -1;
                if (case_mask & CASE_U) {
                    if (cr_add_interval(cr, code + 2, code + 3))
                        return -1;
                }
                break;
            default:
            def_case:
                if (cr_add_interval(cr, code, code + len))
                    return -1;
                break;
            }
        }
    }
    return 0;
}